

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_set.cpp
# Opt level: O2

unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>,_true> __thiscall
duckdb::Transformer::TransformSetVariable(Transformer *this,PGVariableSetStmt *stmt)

{
  undefined1 auVar1 [8];
  Transformer *pTVar2;
  bool bVar3;
  pointer pPVar4;
  BaseExpression *this_00;
  ColumnRefExpression *this_01;
  string *psVar5;
  NotImplementedException *this_02;
  ParserException *this_03;
  long in_RDX;
  SetScope scope;
  undefined1 local_120 [8];
  Value val;
  LogicalType local_d8;
  Transformer *local_c0 [8];
  string name;
  string local_60;
  string local_40;
  
  if (*(int *)(in_RDX + 8) == 0) {
    this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&val,"SET LOCAL is not implemented.",(allocator *)local_c0);
    NotImplementedException::NotImplementedException(this_02,(string *)&val);
    __cxa_throw(this_02,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::string((string *)&name,*(char **)(in_RDX + 0x10),(allocator *)&val);
  if (*(int *)(*(long *)(in_RDX + 0x18) + 4) == 1) {
    scope = anon_unknown_423::ToSetScope(*(VariableSetScope *)(in_RDX + 8));
    TransformExpression((Transformer *)local_120,(optional_ptr<duckdb_libpgquery::PGNode,_true>)stmt
                       );
    pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)local_120);
    if ((pPVar4->super_BaseExpression).type == COLUMN_REF) {
      this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)local_120)->super_BaseExpression;
      this_01 = BaseExpression::Cast<duckdb::ColumnRefExpression>(this_00);
      LogicalType::LogicalType(&local_d8,SQLNULL);
      Value::Value(&val,&local_d8);
      LogicalType::~LogicalType(&local_d8);
      bVar3 = ColumnRefExpression::IsQualified(this_01);
      if (bVar3) {
        pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)local_120);
        (*(pPVar4->super_BaseExpression)._vptr_BaseExpression[8])(&local_60,pPVar4);
        Value::Value((Value *)local_c0,&local_60);
        Value::operator=(&val,(Value *)local_c0);
        Value::~Value((Value *)local_c0);
        psVar5 = &local_60;
      }
      else {
        psVar5 = ColumnRefExpression::GetColumnName_abi_cxx11_(this_01);
        ::std::__cxx11::string::string((string *)&local_40,(string *)psVar5);
        Value::Value((Value *)local_c0,&local_40);
        Value::operator=(&val,(Value *)local_c0);
        Value::~Value((Value *)local_c0);
        psVar5 = &local_40;
      }
      ::std::__cxx11::string::~string((string *)psVar5);
      make_uniq<duckdb::ConstantExpression,duckdb::Value>((duckdb *)local_c0,&val);
      pTVar2 = local_c0[0];
      auVar1 = local_120;
      local_c0[0] = (Transformer *)0x0;
      local_120 = (undefined1  [8])pTVar2;
      if (auVar1 != (undefined1  [8])0x0) {
        (*(code *)((optional_ptr<duckdb::Transformer,_true> *)auVar1)->ptr->options)();
        if (local_c0[0] != (Transformer *)0x0) {
          (*(code *)((local_c0[0]->parent).ptr)->options)();
        }
      }
      Value::~Value(&val);
    }
    pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)local_120);
    if ((pPVar4->super_BaseExpression).type == VALUE_DEFAULT) {
      make_uniq<duckdb::ResetVariableStatement,std::__cxx11::string,duckdb::SetScope&>
                ((duckdb *)&val,&name,&scope);
    }
    else {
      make_uniq<duckdb::SetVariableStatement,std::__cxx11::string,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::SetScope&>
                ((duckdb *)&val,&name,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_120,&scope);
    }
    (this->parent).ptr = (Transformer *)val.type_._0_8_;
    if (local_120 != (undefined1  [8])0x0) {
      (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_120)->ptr->options)();
    }
    ::std::__cxx11::string::~string((string *)&name);
    return (unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>_>)
           (unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>_>)this;
  }
  this_03 = (ParserException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&val,"SET needs a single scalar value parameter",(allocator *)local_c0);
  ParserException::ParserException(this_03,(string *)&val);
  __cxa_throw(this_03,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<SetStatement> Transformer::TransformSetVariable(duckdb_libpgquery::PGVariableSetStmt &stmt) {
	if (stmt.scope == duckdb_libpgquery::VariableSetScope::VAR_SET_SCOPE_LOCAL) {
		throw NotImplementedException("SET LOCAL is not implemented.");
	}

	string name(stmt.name);
	D_ASSERT(!name.empty()); // parser protect us!
	if (stmt.args->length != 1) {
		throw ParserException("SET needs a single scalar value parameter");
	}
	auto scope = ToSetScope(stmt.scope);
	D_ASSERT(stmt.args->head && stmt.args->head->data.ptr_value);
	auto const_val = PGPointerCast<duckdb_libpgquery::PGNode>(stmt.args->head->data.ptr_value);
	auto expr = TransformExpression(const_val);
	if (expr->GetExpressionType() == ExpressionType::COLUMN_REF) {
		auto &colref = expr->Cast<ColumnRefExpression>();
		Value val;
		if (!colref.IsQualified()) {
			val = Value(colref.GetColumnName());
		} else {
			val = Value(expr->ToString());
		}
		expr = make_uniq<ConstantExpression>(std::move(val));
	}
	if (expr->GetExpressionType() == ExpressionType::VALUE_DEFAULT) {
		// set to default = reset
		return make_uniq<ResetVariableStatement>(std::move(name), scope);
	}
	return make_uniq<SetVariableStatement>(std::move(name), std::move(expr), scope);
}